

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,Flags flags)

{
  int iVar1;
  ulong uVar2;
  deUint32 *pdVar3;
  long lVar4;
  float *pfVar5;
  TestLog *pTVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkBuffer buffer;
  VkBuffer obj;
  bool bVar8;
  Allocation *pAVar9;
  VkCommandBuffer commandBuffer;
  uint uVar10;
  deUint32 queueFamilyIndex;
  int iVar11;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat TVar12;
  const_iterator cVar13;
  GraphicsPipelineBuilder *pGVar14;
  ulong uVar15;
  NotSupportedError *this;
  int iVar16;
  ConstPixelBufferAccess *access;
  void *__buf;
  int iVar17;
  uint uVar18;
  int z;
  VkDeviceSize bufferSize;
  int iVar19;
  int iVar20;
  int iVar21;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  ConstPixelBufferAccess image;
  Image local_688;
  Vector<int,_2> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  undefined1 local_638 [8];
  float afStack_630 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  VkRenderPass local_618;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_610;
  TextureFormat local_5f0;
  int iStack_5e8;
  int iStack_5e4;
  int local_5e0;
  int local_5d4;
  void *local_5d0;
  Buffer local_5c8;
  VkCommandBuffer local_598;
  long *plStack_590;
  VkPhysicalDeviceType local_588;
  char cStack_584;
  char cStack_583;
  char cStack_582;
  char cStack_581;
  char acStack_580 [8];
  undefined8 local_578;
  undefined8 uStack_570;
  undefined4 local_568;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined4 local_548;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined4 local_528;
  VkPipeline local_518;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_510;
  VkCommandPool local_4f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_4f0;
  VkPipelineLayout local_4d8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4d0;
  VkFramebuffer local_4b8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_4b0;
  VkImageView local_498;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_490;
  VkPhysicalDeviceProperties properties;
  GraphicsPipelineBuilder local_138;
  
  uVar18 = 6;
  if ((flags & 8) == 0) {
    uVar10 = flags >> 3 & 2;
    if ((flags & 2) == 0) {
      uVar18 = 0xffffffff;
      if ((flags & 1) != 0) {
        uVar18 = (flags >> 1 & 2) + uVar10 + 2;
      }
    }
    else {
      uVar18 = uVar10 | 4;
    }
  }
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x23);
  local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
       uVar18;
  ::vk::getPhysicalDeviceProperties(&properties,vki,physDevice);
  if ((int)properties.limits.pointSizeRange[1] < (int)uVar18) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)&local_688,(int *)&local_5c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   "Test requires point size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_688);
    tcu::NotSupportedError::NotSupportedError(this,(string *)&local_138);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar6 = context->m_testCtx->m_log;
  if ((flags & 1) != 0) {
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,"Setting point size in vertex shader to 2.0.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 2) != 0) {
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,"Setting point size in tessellation evaluation shader to 4.0.",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 4) != 0) {
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,
               "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 8) != 0) {
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,"Setting point size in geometry shader to 6.0.",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 0x10) != 0) {
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,"Reading point size in geometry shader and adding 2.0.",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  renderSize.m_data[0] = 0x20;
  renderSize.m_data[1] = 0x20;
  makeImageCreateInfo((VkImageCreateInfo *)&properties,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&local_688,vk,device,allocator,(VkImageCreateInfo *)&properties,
               (MemoryRequirement)0x0);
  iVar20 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar12 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize(TVar12);
  bufferSize = (VkDeviceSize)(iVar20 * iVar11);
  makeBufferCreateInfo((VkBufferCreateInfo *)&properties,bufferSize,2);
  tessellation::Buffer::Buffer
            (&local_5c8,vk,device,allocator,(VkBufferCreateInfo *)&properties,(MemoryRequirement)0x1
            );
  local_538 = 1;
  uStack_530 = 1;
  local_528 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                (VkImage)local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_490.m_device = (VkDevice)properties._16_8_;
  DStack_490.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_498.m_internal._0_4_ = properties.apiVersion;
  local_498.m_internal._4_4_ = properties.driverVersion;
  DStack_490.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&properties,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_610.m_device = (VkDevice)properties._16_8_;
  DStack_610.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_618.m_internal._0_4_ = properties.apiVersion;
  local_618.m_internal._4_4_ = properties.driverVersion;
  DStack_610.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                  (VkRenderPass)properties._0_8_,local_498,renderSize.m_data[0],renderSize.m_data[1]
                  ,1);
  DStack_4b0.m_device = (VkDevice)properties._16_8_;
  DStack_4b0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4b8.m_internal._0_4_ = properties.apiVersion;
  local_4b8.m_internal._4_4_ = properties.driverVersion;
  DStack_4b0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device);
  DStack_4d0.m_device = (VkDevice)properties._16_8_;
  DStack_4d0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4d8.m_internal._0_4_ = properties.apiVersion;
  local_4d8.m_internal._4_4_ = properties.driverVersion;
  DStack_4d0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&properties,vk,device,queueFamilyIndex);
  DStack_4f0.m_device = (VkDevice)properties._16_8_;
  DStack_4f0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4f8.m_internal._0_4_ = properties.apiVersion;
  local_4f8.m_internal._4_4_ = properties.driverVersion;
  DStack_4f0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&properties,vk,device,(VkCommandPool)properties._0_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_588 = properties.deviceType;
  cStack_584 = properties.deviceName[0];
  cStack_583 = properties.deviceName[1];
  cStack_582 = properties.deviceName[2];
  cStack_581 = properties.deviceName[3];
  acStack_580[0] = properties.deviceName[4];
  acStack_580[1] = properties.deviceName[5];
  acStack_580[2] = properties.deviceName[6];
  acStack_580[3] = properties.deviceName[7];
  acStack_580[4] = properties.deviceName[8];
  acStack_580[5] = properties.deviceName[9];
  acStack_580[6] = properties.deviceName[10];
  acStack_580[7] = properties.deviceName[0xb];
  local_598 = (VkCommandBuffer)properties._0_8_;
  plStack_590 = (long *)properties._8_8_;
  memset(&local_138.m_vertexShaderModule,0,0xf4);
  local_138.m_blendEnable = false;
  local_138.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_138.m_renderSize.m_data = renderSize.m_data;
  local_138.m_patchControlPoints = 1;
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  properties._0_8_ = &properties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"vert","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&properties);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (&local_138,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  TVar12 = (TextureFormat)(image.m_size.m_data + 2);
  image.m_format = TVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"frag","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&image);
  GraphicsPipelineBuilder::setShader
            (pGVar14,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,*(ProgramBinary **)(cVar13._M_node + 2),
             (VkSpecializationInfo *)0x0);
  if (image.m_format != TVar12) {
    operator_delete((void *)image.m_format,
                    CONCAT44(image.m_pitch.m_data[0],image.m_size.m_data[2]) + 1);
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if ((flags & 6) != 0) {
    p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"tesc","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var7,(key_type *)&properties);
    pGVar14 = GraphicsPipelineBuilder::setShader
                        (&local_138,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                         *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    image.m_format = TVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&image,"tese","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var7,(key_type *)&image);
    GraphicsPipelineBuilder::setShader
              (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
               *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    if (image.m_format != TVar12) {
      operator_delete((void *)image.m_format,
                      CONCAT44(image.m_pitch.m_data[0],image.m_size.m_data[2]) + 1);
    }
    if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
      operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
    }
  }
  if ((flags & 0x18) != 0) {
    p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"geom","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var7,(key_type *)&properties);
    GraphicsPipelineBuilder::setShader
              (&local_138,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
               *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
      operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
    }
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&properties,&local_138,vk,device,local_4d8,
             local_618);
  commandBuffer = local_598;
  DStack_510.m_device = (VkDevice)properties._16_8_;
  DStack_510.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_518.m_internal._0_4_ = properties.apiVersion;
  local_518.m_internal._4_4_ = properties.driverVersion;
  DStack_510.m_deviceIface = (DeviceInterface *)properties._8_8_;
  beginCommandBuffer(vk,local_598);
  local_558 = 1;
  uStack_550 = 1;
  local_548 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,1,0x80,0,0,0,0,0,1,(int)&properties);
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = renderSize.m_data[0];
  properties.deviceID = renderSize.m_data[1];
  image.m_format.order = R;
  image.m_format.type = SNORM_INT8;
  image.m_size.m_data[0] = 0;
  image.m_size.m_data[1] = 0x3f800000;
  beginRenderPass(vk,commandBuffer,local_618,local_4b8,(VkRect2D *)&properties,(Vec4 *)&image);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_518.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1,0,0);
  endRenderPass(vk,commandBuffer);
  local_578 = 1;
  uStack_570 = 1;
  local_568 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0x100,0x800,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)&properties);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&properties,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,
             local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             CONCAT44(local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                      .m_internal._4_4_,
                      (uint)local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                            object.m_internal),1,(int)&properties);
  buffer.m_internal._4_4_ =
       local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  buffer.m_internal._0_4_ =
       (uint)local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  makeBufferMemoryBarrier((VkBufferMemoryBarrier *)&properties,0x1000,0x2000,buffer,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x4000,0,0,0,1,&properties,0,0);
  endCommandBuffer(vk,commandBuffer);
  submitCommandsAndWait(vk,device,queue,commandBuffer);
  pAVar9 = local_5c8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_5c8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_5c8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  properties._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image,(TextureFormat *)&properties,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar9->m_hostPtr);
  pTVar6 = context->m_testCtx->m_log;
  local_638 = (undefined1  [8])&local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"color0","");
  res.m_data = (int  [2])&local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"");
  access = &image;
  tcu::LogImage::LogImage
            ((LogImage *)&properties,(string *)local_638,(string *)&res,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&properties,(int)pTVar6,__buf,(size_t)access);
  if ((char *)properties.deviceName._12_8_ != properties.deviceName + 0x1c) {
    operator_delete((void *)properties.deviceName._12_8_,properties.deviceName._28_8_ + 1);
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if (res.m_data != (int  [2])&local_648) {
    operator_delete((void *)res.m_data,local_648._M_allocated_capacity + 1);
  }
  if (local_638 != (undefined1  [8])&local_628) {
    operator_delete((void *)local_638,local_628._M_allocated_capacity + 1);
  }
  local_5f0 = image.m_format;
  iStack_5e8 = image.m_size.m_data[0];
  iStack_5e4 = image.m_size.m_data[1];
  local_5e0 = image.m_size.m_data[2];
  local_5d4 = image.m_pitch.m_data[2];
  local_5d0 = image.m_data;
  pdVar3 = &properties.vendorID;
  properties._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar3,"Verifying rendered point size. Expecting ",0x29);
  std::ostream::operator<<(pdVar3,uVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3," pixels.",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
  std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  local_638 = (undefined1  [8])0x0;
  afStack_630[0] = 0.0;
  afStack_630[1] = 1.0;
  if (iStack_5e4 < 1) {
LAB_0078e3d1:
    properties._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&properties.vendorID);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&properties.vendorID,
               "Verification failed, could not find any point fragments.",0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    bVar8 = false;
    iVar19 = 0;
    iVar11 = 0;
    iVar20 = 0;
    iVar21 = 0;
    z = 0;
    iVar17 = iStack_5e8;
    iVar16 = iStack_5e4;
    do {
      iVar1 = z + 1;
      if (0 < iVar17) {
        iVar17 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&properties,(int)&local_5f0,iVar17,z);
          if (((float)properties.apiVersion != 0.0) || (NAN((float)properties.apiVersion))) {
LAB_0078e29f:
            if (bVar8) {
              if (iVar17 <= iVar19) {
                iVar19 = iVar17;
              }
              if (z <= iVar11) {
                iVar11 = z;
              }
              if (iVar20 <= iVar17 + 1) {
                iVar20 = iVar17 + 1;
              }
              if (iVar21 <= iVar1) {
                iVar21 = iVar1;
              }
            }
            else {
              iVar20 = iVar17 + 1;
              bVar8 = true;
              iVar19 = iVar17;
              iVar11 = z;
              iVar21 = iVar1;
            }
          }
          else {
            uVar15 = 0xffffffffffffffff;
            do {
              if (uVar15 == 2) goto LAB_0078e315;
              lVar4 = uVar15 * 4;
              uVar2 = uVar15 + 1;
              pfVar5 = afStack_630 + uVar15;
            } while ((*(float *)(properties.deviceName + lVar4 + -0xc) == *pfVar5) &&
                    (uVar15 = uVar2,
                    !NAN(*(float *)(properties.deviceName + lVar4 + -0xc)) && !NAN(*pfVar5)));
            if (uVar2 < 3) goto LAB_0078e29f;
          }
LAB_0078e315:
          iVar17 = iVar17 + 1;
        } while (iVar17 < iStack_5e8);
        iVar17 = iStack_5e8;
        iVar16 = iStack_5e4;
      }
      z = iVar1;
    } while (iVar1 < iVar16);
    if (!bVar8) goto LAB_0078e3d1;
    uVar10 = iVar20 - iVar19;
    res.m_data[1] = iVar21 - iVar11;
    res.m_data[0] = uVar10;
    if (uVar10 == iVar21 - iVar11) {
      if (uVar10 == uVar18) {
        properties._0_8_ = &properties.deviceType;
        std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"OK","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
                   properties._8_8_ + properties._0_8_);
        goto LAB_0078e488;
      }
      pdVar3 = &properties.vendorID;
      properties._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar3,"ERROR! Point size invalid, expected ",0x24);
      std::ostream::operator<<(pdVar3,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3,", got ",6);
      std::ostream::operator<<(pdVar3,uVar10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      pdVar3 = &properties.vendorID;
      properties._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar3,"ERROR! Rasterized point is not a square. Point size was ",0x38);
      tcu::operator<<((ostream *)pdVar3,&res);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&properties.vendorID);
  std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  properties._0_8_ = &properties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&properties,"Didn\'t render expected point","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
             properties._8_8_ + properties._0_8_);
LAB_0078e488:
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if (local_518.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_510,local_518);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_138);
  if (commandBuffer != (VkCommandBuffer)0x0) {
    properties._0_8_ = commandBuffer;
    (**(code **)(*plStack_590 + 0x240))(plStack_590,_local_588,acStack_580,1);
  }
  if (local_4f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_4f0,local_4f8);
  }
  if (local_4d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4d0,local_4d8);
  }
  if (local_4b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_4b0,local_4b8);
  }
  if (local_618.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_610,local_618);
  }
  if (local_498.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_490,local_498);
  }
  if (local_5c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_5c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_5c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  obj.m_internal._4_4_ =
       local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  obj.m_internal._0_4_ =
       (uint)local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_5c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj)
    ;
  }
  if (local_688.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_688.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_688.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_688.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const Flags flags)
{
	const int expectedPointSize = getExpectedPointSize(flags);
	{
		const InstanceInterface& vki        = context.getInstanceInterface();
		const VkPhysicalDevice   physDevice = context.getPhysicalDevice();

		requireFeatures           (vki, physDevice, FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_SHADER_TESSELLATION_AND_GEOMETRY_POINT_SIZE);
		checkPointSizeRequirements(vki, physDevice, expectedPointSize);
	}
	{
		tcu::TestLog& log = context.getTestContext().getLog();

		if (flags & FLAG_VERTEX_SET)
			log << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_EVALUATION_SET)
			log << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_ADD)
			log << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_SET)
			log << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_ADD)
			log << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	}

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer

	const VkDeviceSize	colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer          (vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	GraphicsPipelineBuilder			pipelineBuilder;

	pipelineBuilder
		.setPrimitiveTopology		  (VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (1)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL);

	if (isTessellationStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL);

	if (isGeometryStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				context.getBinaryCollection().get("geom"), DE_NULL);

	const Unique<VkPipeline> pipeline(pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);
		tcu::ConstPixelBufferAccess image(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, alloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogImage("color0", "", image);

		if (verifyImage(log, image, expectedPointSize))
			return tcu::TestStatus::pass("OK");
		else
			return tcu::TestStatus::fail("Didn't render expected point");
	}
}